

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O0

int32_t __thiscall
icu_63::ThaiBreakEngine::divideUpDictionaryRange
          (ThaiBreakEngine *this,UText *text,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  UBool UVar1;
  UChar32 UVar2;
  int iVar3;
  UChar32 c;
  int32_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  bool bVar7;
  PossibleWord *local_400;
  PossibleWord *local_2b8;
  int32_t maiyamokIndex;
  int32_t paiyannoiIndex;
  int32_t currPos;
  int32_t num_candidates;
  int32_t pcSize;
  int32_t pcIndex;
  int32_t chars;
  UChar32 pc;
  int32_t remaining;
  UChar32 uc;
  int32_t wordsMatched;
  int32_t candidates;
  undefined1 local_268 [8];
  PossibleWord words [3];
  UErrorCode local_44;
  int local_40;
  UErrorCode status;
  int32_t current;
  int32_t cuWordLength;
  int32_t cpWordLength;
  uint32_t wordsFound;
  UVector32 *foundBreaks_local;
  int32_t rangeEnd_local;
  int32_t rangeStart_local;
  UText *text_local;
  ThaiBreakEngine *this_local;
  
  _cpWordLength = foundBreaks;
  foundBreaks_local._0_4_ = rangeEnd;
  foundBreaks_local._4_4_ = rangeStart;
  _rangeEnd_local = text;
  text_local = (UText *)this;
  utext_setNativeIndex_63(text,(long)rangeStart);
  utext_moveIndex32_63(_rangeEnd_local,4);
  iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
  if (iVar5 < (int32_t)foundBreaks_local) {
    utext_setNativeIndex_63(_rangeEnd_local,(long)foundBreaks_local._4_4_);
    cuWordLength = 0;
    current = 0;
    status = U_ZERO_ERROR;
    local_44 = U_ZERO_ERROR;
    local_2b8 = (PossibleWord *)local_268;
    do {
      PossibleWord::PossibleWord(local_2b8);
      local_2b8 = local_2b8 + 1;
    } while (local_2b8 != (PossibleWord *)(words[2].cpLengths + 0x12));
    utext_setNativeIndex_63(_rangeEnd_local,(long)foundBreaks_local._4_4_);
    while( true ) {
      UVar1 = ::U_SUCCESS(local_44);
      bVar7 = false;
      if (UVar1 != '\0') {
        iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
        local_40 = (int)iVar5;
        bVar7 = local_40 < (int32_t)foundBreaks_local;
      }
      if (!bVar7) break;
      current = 0;
      status = U_ZERO_ERROR;
      iVar4 = PossibleWord::candidates
                        ((PossibleWord *)
                         (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                         _rangeEnd_local,this->fDictionary,(int32_t)foundBreaks_local);
      if (iVar4 == 1) {
        status = PossibleWord::acceptMarked
                           ((PossibleWord *)
                            (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                            _rangeEnd_local);
        current = PossibleWord::markedCPLength
                            ((PossibleWord *)
                             (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12));
        cuWordLength = cuWordLength + 1;
      }
      else if (1 < iVar4) {
        iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
        if ((int)iVar5 < (int32_t)foundBreaks_local) {
          do {
            iVar4 = PossibleWord::candidates
                              ((PossibleWord *)
                               (words[(ulong)(cuWordLength + 1 + ((cuWordLength + 1U) / 3) * -3) - 1
                                     ].cpLengths + 0x12),_rangeEnd_local,this->fDictionary,
                               (int32_t)foundBreaks_local);
            if (0 < iVar4) {
              PossibleWord::markCurrent
                        ((PossibleWord *)
                         (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12));
              iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
              if ((int32_t)foundBreaks_local <= (int)iVar5) break;
              do {
                iVar4 = PossibleWord::candidates
                                  ((PossibleWord *)
                                   (words[(ulong)(cuWordLength + 2 + ((cuWordLength + 2U) / 3) * -3)
                                          - 1].cpLengths + 0x12),_rangeEnd_local,this->fDictionary,
                                   (int32_t)foundBreaks_local);
                if (iVar4 != 0) {
                  PossibleWord::markCurrent
                            ((PossibleWord *)
                             (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12));
                  goto LAB_002234fc;
                }
                UVar1 = PossibleWord::backUp
                                  ((PossibleWord *)
                                   (words[(ulong)(cuWordLength + 1 + ((cuWordLength + 1U) / 3) * -3)
                                          - 1].cpLengths + 0x12),_rangeEnd_local);
              } while (UVar1 != '\0');
            }
            UVar1 = PossibleWord::backUp
                              ((PossibleWord *)
                               (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                               _rangeEnd_local);
          } while (UVar1 != '\0');
        }
LAB_002234fc:
        status = PossibleWord::acceptMarked
                           ((PossibleWord *)
                            (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                            _rangeEnd_local);
        current = PossibleWord::markedCPLength
                            ((PossibleWord *)
                             (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12));
        cuWordLength = cuWordLength + 1;
      }
      iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
      if (((int)iVar5 < (int32_t)foundBreaks_local) && (current < 3)) {
        iVar4 = PossibleWord::candidates
                          ((PossibleWord *)
                           (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                           _rangeEnd_local,this->fDictionary,(int32_t)foundBreaks_local);
        if ((iVar4 < 1) &&
           ((status == U_ZERO_ERROR ||
            (iVar4 = PossibleWord::longestPrefix
                               ((PossibleWord *)
                                (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12)),
            iVar4 < 3)))) {
          chars = (int32_t)foundBreaks_local - (local_40 + status);
          pcSize = 0;
          do {
            do {
              iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
              UVar2 = utext_next32_63(_rangeEnd_local);
              iVar6 = utext_getNativeIndex_63(_rangeEnd_local);
              iVar3 = (int)iVar6 - (int)iVar5;
              pcSize = iVar3 + pcSize;
              chars = chars - iVar3;
              if (chars < 1) goto LAB_0022382d;
              c = utext_current32_63(_rangeEnd_local);
              UVar1 = UnicodeSet::contains(&this->fEndWordSet,UVar2);
            } while ((UVar1 == '\0') ||
                    (UVar1 = UnicodeSet::contains(&this->fBeginWordSet,c), UVar1 == '\0'));
            iVar4 = PossibleWord::candidates
                              ((PossibleWord *)
                               (words[(ulong)(cuWordLength + 1 + ((cuWordLength + 1U) / 3) * -3) - 1
                                     ].cpLengths + 0x12),_rangeEnd_local,this->fDictionary,
                               (int32_t)foundBreaks_local);
            utext_setNativeIndex_63(_rangeEnd_local,(long)(local_40 + status + pcSize));
          } while (iVar4 < 1);
LAB_0022382d:
          if (status < U_ILLEGAL_ARGUMENT_ERROR) {
            cuWordLength = cuWordLength + 1;
          }
          status = pcSize + status;
        }
        else {
          utext_setNativeIndex_63(_rangeEnd_local,(long)(local_40 + status));
        }
      }
      while( true ) {
        iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
        bVar7 = false;
        if ((int)iVar5 < (int32_t)foundBreaks_local) {
          UVar2 = utext_current32_63(_rangeEnd_local);
          UVar1 = UnicodeSet::contains(&this->fMarkSet,UVar2);
          bVar7 = UVar1 != '\0';
        }
        if (!bVar7) break;
        utext_next32_63(_rangeEnd_local);
        iVar6 = utext_getNativeIndex_63(_rangeEnd_local);
        status = ((int)iVar6 - (int)iVar5) + status;
      }
      iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
      if (((int)iVar5 < (int32_t)foundBreaks_local) && (U_ZERO_ERROR < status)) {
        iVar4 = PossibleWord::candidates
                          ((PossibleWord *)
                           (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                           _rangeEnd_local,this->fDictionary,(int32_t)foundBreaks_local);
        if (iVar4 < 1) {
          pc = utext_current32_63(_rangeEnd_local);
          UVar1 = UnicodeSet::contains(&this->fSuffixSet,pc);
          if (UVar1 != '\0') {
            if (pc == 0xe2f) {
              UVar2 = utext_previous32_63(_rangeEnd_local);
              UVar1 = UnicodeSet::contains(&this->fSuffixSet,UVar2);
              if (UVar1 == '\0') {
                utext_next32_63(_rangeEnd_local);
                iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
                utext_next32_63(_rangeEnd_local);
                iVar6 = utext_getNativeIndex_63(_rangeEnd_local);
                status = status + ((int)iVar6 - (int)iVar5);
                pc = utext_current32_63(_rangeEnd_local);
              }
              else {
                utext_next32_63(_rangeEnd_local);
              }
            }
            if (pc == 0xe46) {
              UVar2 = utext_previous32_63(_rangeEnd_local);
              if (UVar2 == 0xe46) {
                utext_next32_63(_rangeEnd_local);
              }
              else {
                utext_next32_63(_rangeEnd_local);
                iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
                utext_next32_63(_rangeEnd_local);
                iVar6 = utext_getNativeIndex_63(_rangeEnd_local);
                status = ((int)iVar6 - (int)iVar5) + status;
              }
            }
            goto LAB_00223b9d;
          }
        }
        utext_setNativeIndex_63(_rangeEnd_local,(long)(local_40 + status));
      }
LAB_00223b9d:
      if (U_ZERO_ERROR < status) {
        UVector32::push(_cpWordLength,local_40 + status,&local_44);
      }
    }
    iVar4 = UVector32::peeki(_cpWordLength);
    if ((int32_t)foundBreaks_local <= iVar4) {
      UVector32::popi(_cpWordLength);
      cuWordLength = cuWordLength + -1;
    }
    this_local._4_4_ = cuWordLength;
    local_400 = (PossibleWord *)(words[2].cpLengths + 0x12);
    do {
      local_400 = local_400 + -1;
      PossibleWord::~PossibleWord(local_400);
    } while (local_400 != (PossibleWord *)local_268);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
ThaiBreakEngine::divideUpDictionaryRange( UText *text,
                                                int32_t rangeStart,
                                                int32_t rangeEnd,
                                                UVector32 &foundBreaks ) const {
    utext_setNativeIndex(text, rangeStart);
    utext_moveIndex32(text, THAI_MIN_WORD_SPAN);
    if (utext_getNativeIndex(text) >= rangeEnd) {
        return 0;       // Not enough characters for two words
    }
    utext_setNativeIndex(text, rangeStart);


    uint32_t wordsFound = 0;
    int32_t cpWordLength = 0;    // Word Length in Code Points.
    int32_t cuWordLength = 0;    // Word length in code units (UText native indexing)
    int32_t current;
    UErrorCode status = U_ZERO_ERROR;
    PossibleWord words[THAI_LOOKAHEAD];
    
    utext_setNativeIndex(text, rangeStart);
    
    while (U_SUCCESS(status) && (current = (int32_t)utext_getNativeIndex(text)) < rangeEnd) {
        cpWordLength = 0;
        cuWordLength = 0;

        // Look for candidate words at the current position
        int32_t candidates = words[wordsFound%THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
        
        // If we found exactly one, use that
        if (candidates == 1) {
            cuWordLength = words[wordsFound % THAI_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % THAI_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        // If there was more than one, see which one can take us forward the most words
        else if (candidates > 1) {
            // If we're already at the end of the range, we're done
            if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                goto foundBest;
            }
            do {
                int32_t wordsMatched = 1;
                if (words[(wordsFound + 1) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) > 0) {
                    if (wordsMatched < 2) {
                        // Followed by another dictionary word; mark first word as a good candidate
                        words[wordsFound%THAI_LOOKAHEAD].markCurrent();
                        wordsMatched = 2;
                    }
                    
                    // If we're already at the end of the range, we're done
                    if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                        goto foundBest;
                    }
                    
                    // See if any of the possible second words is followed by a third word
                    do {
                        // If we find a third word, stop right away
                        if (words[(wordsFound + 2) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd)) {
                            words[wordsFound % THAI_LOOKAHEAD].markCurrent();
                            goto foundBest;
                        }
                    }
                    while (words[(wordsFound + 1) % THAI_LOOKAHEAD].backUp(text));
                }
            }
            while (words[wordsFound % THAI_LOOKAHEAD].backUp(text));
foundBest:
            // Set UText position to after the accepted word.
            cuWordLength = words[wordsFound % THAI_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % THAI_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        
        // We come here after having either found a word or not. We look ahead to the
        // next word. If it's not a dictionary word, we will combine it with the word we
        // just found (if there is one), but only if the preceding word does not exceed
        // the threshold.
        // The text iterator should now be positioned at the end of the word we found.
        
        UChar32 uc = 0;
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd &&  cpWordLength < THAI_ROOT_COMBINE_THRESHOLD) {
            // if it is a dictionary word, do nothing. If it isn't, then if there is
            // no preceding word, or the non-word shares less than the minimum threshold
            // of characters with a dictionary word, then scan to resynchronize
            if (words[wordsFound % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                  && (cuWordLength == 0
                      || words[wordsFound%THAI_LOOKAHEAD].longestPrefix() < THAI_PREFIX_COMBINE_THRESHOLD)) {
                // Look for a plausible word boundary
                int32_t remaining = rangeEnd - (current+cuWordLength);
                UChar32 pc;
                int32_t chars = 0;
                for (;;) {
                    int32_t pcIndex = (int32_t)utext_getNativeIndex(text);
                    pc = utext_next32(text);
                    int32_t pcSize = (int32_t)utext_getNativeIndex(text) - pcIndex;
                    chars += pcSize;
                    remaining -= pcSize;
                    if (remaining <= 0) {
                        break;
                    }
                    uc = utext_current32(text);
                    if (fEndWordSet.contains(pc) && fBeginWordSet.contains(uc)) {
                        // Maybe. See if it's in the dictionary.
                        // NOTE: In the original Apple code, checked that the next
                        // two characters after uc were not 0x0E4C THANTHAKHAT before
                        // checking the dictionary. That is just a performance filter,
                        // but it's not clear it's faster than checking the trie.
                        int32_t num_candidates = words[(wordsFound + 1) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
                        utext_setNativeIndex(text, current + cuWordLength + chars);
                        if (num_candidates > 0) {
                            break;
                        }
                    }
                }
                
                // Bump the word count if there wasn't already one
                if (cuWordLength <= 0) {
                    wordsFound += 1;
                }
                
                // Update the length with the passed-over characters
                cuWordLength += chars;
            }
            else {
                // Back up to where we were for next iteration
                utext_setNativeIndex(text, current+cuWordLength);
            }
        }
        
        // Never stop before a combining mark.
        int32_t currPos;
        while ((currPos = (int32_t)utext_getNativeIndex(text)) < rangeEnd && fMarkSet.contains(utext_current32(text))) {
            utext_next32(text);
            cuWordLength += (int32_t)utext_getNativeIndex(text) - currPos;
        }
        
        // Look ahead for possible suffixes if a dictionary word does not follow.
        // We do this in code rather than using a rule so that the heuristic
        // resynch continues to function. For example, one of the suffix characters
        // could be a typo in the middle of a word.
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd && cuWordLength > 0) {
            if (words[wordsFound%THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                && fSuffixSet.contains(uc = utext_current32(text))) {
                if (uc == THAI_PAIYANNOI) {
                    if (!fSuffixSet.contains(utext_previous32(text))) {
                        // Skip over previous end and PAIYANNOI
                        utext_next32(text);
                        int32_t paiyannoiIndex = (int32_t)utext_getNativeIndex(text);
                        utext_next32(text);
                        cuWordLength += (int32_t)utext_getNativeIndex(text) - paiyannoiIndex;    // Add PAIYANNOI to word
                        uc = utext_current32(text);     // Fetch next character
                    }
                    else {
                        // Restore prior position
                        utext_next32(text);
                    }
                }
                if (uc == THAI_MAIYAMOK) {
                    if (utext_previous32(text) != THAI_MAIYAMOK) {
                        // Skip over previous end and MAIYAMOK
                        utext_next32(text);
                        int32_t maiyamokIndex = (int32_t)utext_getNativeIndex(text);
                        utext_next32(text);
                        cuWordLength += (int32_t)utext_getNativeIndex(text) - maiyamokIndex;    // Add MAIYAMOK to word
                    }
                    else {
                        // Restore prior position
                        utext_next32(text);
                    }
                }
            }
            else {
                utext_setNativeIndex(text, current+cuWordLength);
            }
        }

        // Did we find a word on this iteration? If so, push it on the break stack
        if (cuWordLength > 0) {
            foundBreaks.push((current+cuWordLength), status);
        }
    }

    // Don't return a break for the end of the dictionary range if there is one there.
    if (foundBreaks.peeki() >= rangeEnd) {
        (void) foundBreaks.popi();
        wordsFound -= 1;
    }

    return wordsFound;
}